

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h__Writer.cpp
# Opt level: O2

h__ASDCPWriter * __thiscall ASDCP::h__ASDCPWriter::WriteASDCPFooter(h__ASDCPWriter *this)

{
  IFileReader *this_00;
  uint uVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ui64_t uVar5;
  MDDEntry *pMVar6;
  long *plVar7;
  long in_RSI;
  undefined1 local_f8 [208];
  
  uVar1 = *(uint *)(in_RSI + 0x338);
  plVar7 = (long *)(in_RSI + 0x428);
  while (plVar7 = (long *)*plVar7, plVar7 != (long *)(in_RSI + 0x428)) {
    *(ulong *)plVar7[2] = (ulong)uVar1;
  }
  lVar2 = *(long *)(in_RSI + 0x318);
  *(ulong *)(lVar2 + 0xf8) = (ulong)uVar1;
  *(undefined1 *)(lVar2 + 0x100) = 1;
  *(undefined8 *)(in_RSI + 0x5f8) = *(undefined8 *)(*(long *)(in_RSI + 0x2f0) + 0x20);
  this_00 = (IFileReader *)(in_RSI + 0x10);
  uVar5 = Kumu::IFileReader::TellPosition(this_00);
  local_f8._0_8_ = &PTR__IArchive_00216798;
  local_f8._8_4_ = 0;
  local_f8._16_8_ = uVar5;
  std::__cxx11::
  list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>::push_back
            ((list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
              *)(in_RSI + 0x2e8),(value_type *)local_f8);
  *(ui64_t *)(in_RSI + 0xe8) = uVar5;
  if (*(Dictionary **)(in_RSI + 8) != (Dictionary *)0x0) {
    pMVar6 = Dictionary::Type(*(Dictionary **)(in_RSI + 8),MDD_OPAtom);
    uVar3 = *(undefined8 *)pMVar6->ul;
    uVar4 = *(undefined8 *)(pMVar6->ul + 8);
    *(undefined1 *)(in_RSI + 0x120) = 1;
    *(undefined8 *)(in_RSI + 0x121) = uVar3;
    *(undefined8 *)(in_RSI + 0x129) = uVar4;
    lVar2 = *(long *)(in_RSI + 0x260);
    *(undefined1 *)(lVar2 + 0x138) = 1;
    *(undefined8 *)(lVar2 + 0x139) = uVar3;
    *(undefined8 *)(lVar2 + 0x141) = uVar4;
    *(undefined1 *)(in_RSI + 0x638) = 1;
    *(undefined8 *)(in_RSI + 0x639) = uVar3;
    *(undefined8 *)(in_RSI + 0x641) = uVar4;
    std::
    _Rb_tree<ASDCP::UL,_ASDCP::UL,_std::_Identity<ASDCP::UL>,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>
    ::operator=((_Rb_tree<ASDCP::UL,_ASDCP::UL,_std::_Identity<ASDCP::UL>,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>
                 *)(in_RSI + 0x658),
                (_Rb_tree<ASDCP::UL,_ASDCP::UL,_std::_Identity<ASDCP::UL>,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>
                 *)(in_RSI + 0x140));
    *(ui64_t *)(in_RSI + 0x600) = uVar5;
    *(ui64_t *)(in_RSI + 0x5f0) = uVar5;
    MXF::OPAtomIndexFooter::WriteToFile
              ((OPAtomIndexFooter *)this,(FileWriter *)(in_RSI + 0x568),(ui64_t)this_00);
    if (-1 < *(int *)&(this->super_TrackFileWriter<ASDCP::MXF::OP1aHeader>)._vptr_TrackFileWriter) {
      MXF::RIP::WriteToFile((RIP *)local_f8,(FileWriter *)(in_RSI + 0x268));
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_f8);
      Kumu::Result_t::~Result_t((Result_t *)local_f8);
      if (-1 < *(int *)&(this->super_TrackFileWriter<ASDCP::MXF::OP1aHeader>)._vptr_TrackFileWriter)
      {
        Kumu::FileReader::Seek((long)local_f8,(SeekPos_t)this_00);
        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_f8);
        Kumu::Result_t::~Result_t((Result_t *)local_f8);
        if (-1 < *(int *)&(this->super_TrackFileWriter<ASDCP::MXF::OP1aHeader>).
                          _vptr_TrackFileWriter) {
          MXF::OP1aHeader::WriteToFile
                    ((OP1aHeader *)local_f8,(FileWriter *)(in_RSI + 0x50),(SeekPos_t)this_00);
          Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_f8);
          Kumu::Result_t::~Result_t((Result_t *)local_f8);
        }
      }
    }
    Kumu::FileReader::Close();
    Kumu::Result_t::~Result_t((Result_t *)(local_f8 + 0x68));
    return this;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/h__Writer.cpp"
                ,0x15e,"Result_t ASDCP::h__ASDCPWriter::WriteASDCPFooter()");
}

Assistant:

Result_t
ASDCP::h__ASDCPWriter::WriteASDCPFooter()
{
  // update all Duration properties
  DurationElementList_t::iterator dli = m_DurationUpdateList.begin();

  for (; dli != m_DurationUpdateList.end(); ++dli )
    {
      **dli = m_FramesWritten;
    }

  m_EssenceDescriptor->ContainerDuration = m_FramesWritten;
  m_FooterPart.PreviousPartition = m_RIP.PairArray.back().ByteOffset;

  Kumu::fpos_t here = m_File.TellPosition();
  m_RIP.PairArray.push_back(RIP::PartitionPair(0, here)); // Last RIP Entry
  m_HeaderPart.FooterPartition = here;

  assert(m_Dict);
  // re-label the header partition, set the footer
  UL OPAtomUL(m_Dict->ul(MDD_OPAtom));
  m_HeaderPart.OperationalPattern = OPAtomUL;
  m_HeaderPart.m_Preface->OperationalPattern = OPAtomUL;
  m_FooterPart.OperationalPattern = OPAtomUL;

  m_FooterPart.EssenceContainers = m_HeaderPart.EssenceContainers;
  m_FooterPart.FooterPartition = here;
  m_FooterPart.ThisPartition = here;

  Result_t result = m_FooterPart.WriteToFile(m_File, m_FramesWritten);

  if ( ASDCP_SUCCESS(result) )
    result = m_RIP.WriteToFile(m_File);

  if ( ASDCP_SUCCESS(result) )
    result = m_File.Seek(0);

  if ( ASDCP_SUCCESS(result) )
    result = m_HeaderPart.WriteToFile(m_File, m_HeaderSize);

  m_File.Close();
  return result;
}